

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::Url::UserInfo> * __thiscall
kj::_::NullableValue<kj::Url::UserInfo>::operator=
          (NullableValue<kj::Url::UserInfo> *this,NullableValue<kj::Url::UserInfo> *other)

{
  UserInfo *params;
  NullableValue<kj::Url::UserInfo> *other_local;
  NullableValue<kj::Url::UserInfo> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::Url::UserInfo>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::Url::UserInfo>(&(other->field_1).value);
      ctor<kj::Url::UserInfo,kj::Url::UserInfo>(&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }